

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

void re2::AddUGroup(CharClassBuilder *cc,UGroup *g,int sign,ParseFlags parse_flags)

{
  URange16 *pUVar1;
  URange32 *pUVar2;
  uint lo;
  int i;
  long lVar3;
  CharClassBuilder ccb1;
  
  if (sign == 1) {
    for (lVar3 = 0; lVar3 < g->nr16; lVar3 = lVar3 + 1) {
      CharClassBuilder::AddRangeFlags(cc,(uint)g->r16[lVar3].lo,(uint)g->r16[lVar3].hi,parse_flags);
    }
    for (lVar3 = 0; lVar3 < g->nr32; lVar3 = lVar3 + 1) {
      CharClassBuilder::AddRangeFlags(cc,g->r32[lVar3].lo,g->r32[lVar3].hi,parse_flags);
    }
  }
  else if ((parse_flags & FoldCase) == NoParseFlags) {
    lo = 0;
    for (lVar3 = 0; lVar3 < g->nr16; lVar3 = lVar3 + 1) {
      pUVar1 = g->r16;
      if (lo < pUVar1[lVar3].lo) {
        CharClassBuilder::AddRangeFlags(cc,lo,pUVar1[lVar3].lo - 1,parse_flags);
        pUVar1 = g->r16;
      }
      lo = pUVar1[lVar3].hi + 1;
    }
    for (lVar3 = 0; lVar3 < g->nr32; lVar3 = lVar3 + 1) {
      pUVar2 = g->r32;
      if ((int)lo < pUVar2[lVar3].lo) {
        CharClassBuilder::AddRangeFlags(cc,lo,pUVar2[lVar3].lo + -1,parse_flags);
        pUVar2 = g->r32;
      }
      lo = pUVar2[lVar3].hi + 1;
    }
    if ((int)lo < 0x110000) {
      CharClassBuilder::AddRangeFlags(cc,lo,0x10ffff,parse_flags);
      return;
    }
  }
  else {
    CharClassBuilder::CharClassBuilder(&ccb1);
    AddUGroup(&ccb1,g,1,parse_flags);
    if ((parse_flags & (NeverNL|ClassNL)) != ClassNL) {
      CharClassBuilder::AddRange(&ccb1,10,10);
    }
    CharClassBuilder::Negate(&ccb1);
    CharClassBuilder::AddCharClass(cc,&ccb1);
    std::
    _Rb_tree<re2::RuneRange,_re2::RuneRange,_std::_Identity<re2::RuneRange>,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_>
    ::~_Rb_tree(&ccb1.ranges_._M_t);
  }
  return;
}

Assistant:

static void AddUGroup(CharClassBuilder *cc, const UGroup *g, int sign,
                      Regexp::ParseFlags parse_flags) {
  if (sign == +1) {
    for (int i = 0; i < g->nr16; i++) {
      cc->AddRangeFlags(g->r16[i].lo, g->r16[i].hi, parse_flags);
    }
    for (int i = 0; i < g->nr32; i++) {
      cc->AddRangeFlags(g->r32[i].lo, g->r32[i].hi, parse_flags);
    }
  } else {
    if (parse_flags & Regexp::FoldCase) {
      // Normally adding a case-folded group means
      // adding all the extra fold-equivalent runes too.
      // But if we're adding the negation of the group,
      // we have to exclude all the runes that are fold-equivalent
      // to what's already missing.  Too hard, so do in two steps.
      CharClassBuilder ccb1;
      AddUGroup(&ccb1, g, +1, parse_flags);
      // If the flags say to take out \n, put it in, so that negating will take it out.
      // Normally AddRangeFlags does this, but we're bypassing AddRangeFlags.
      bool cutnl = !(parse_flags & Regexp::ClassNL) ||
                   (parse_flags & Regexp::NeverNL);
      if (cutnl) {
        ccb1.AddRange('\n', '\n');
      }
      ccb1.Negate();
      cc->AddCharClass(&ccb1);
      return;
    }
    int next = 0;
    for (int i = 0; i < g->nr16; i++) {
      if (next < g->r16[i].lo)
        cc->AddRangeFlags(next, g->r16[i].lo - 1, parse_flags);
      next = g->r16[i].hi + 1;
    }
    for (int i = 0; i < g->nr32; i++) {
      if (next < g->r32[i].lo)
        cc->AddRangeFlags(next, g->r32[i].lo - 1, parse_flags);
      next = g->r32[i].hi + 1;
    }
    if (next <= Runemax)
      cc->AddRangeFlags(next, Runemax, parse_flags);
  }
}